

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O3

void IremGA20_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  if (samples != 0) {
    pDVar4 = *outputs;
    pDVar5 = outputs[1];
    uVar8 = 0;
    do {
      lVar10 = 0;
      iVar9 = 0;
      do {
        if ((*(char *)((long)param + lVar10 + 0x4d) == '\0') &&
           (*(char *)((long)param + lVar10 + 0x4c) != '\0')) {
          iVar7 = (int)*(char *)((long)param + lVar10 + 0x4e);
          if (*(char *)((long)param + 0xa4) == '\0') {
            iVar7 = (uint)*(ushort *)((long)param + lVar10 + 0x48) * iVar7;
            iVar11 = *(int *)((long)param + lVar10 + 0x40);
          }
          else {
            iVar11 = *(int *)((long)param + lVar10 + 0x40);
            iVar7 = (int)((uint)*(ushort *)((long)param + lVar10 + 0x48) *
                         (*(char *)((long)param + lVar10 + 0x4f) * iVar11 +
                         (0x10000 - iVar11) * iVar7)) >> 0x10;
          }
          iVar9 = iVar9 + iVar7;
          *(int *)((long)param + lVar10 + 0x40) = iVar11 + *(int *)((long)param + lVar10 + 0x44);
          pcVar2 = (char *)((long)param + lVar10 + 0x4b);
          *pcVar2 = *pcVar2 + '\x01';
          if (*pcVar2 == '\0') {
            iVar7 = *(int *)((long)param + lVar10 + 0x3c);
            uVar1 = iVar7 + 1;
            *(uint *)((long)param + lVar10 + 0x3c) = uVar1;
            *(undefined4 *)((long)param + lVar10 + 0x40) = 0;
            *(undefined1 *)((long)param + lVar10 + 0x4b) =
                 *(undefined1 *)((long)param + lVar10 + 0x4a);
            lVar6 = *(long *)((long)param + 8);
            cVar3 = *(char *)(lVar6 + (ulong)uVar1);
            if (cVar3 == '\0') {
              *(undefined1 *)((long)param + lVar10 + 0x4c) = 0;
            }
            else {
              *(char *)((long)param + lVar10 + 0x4e) = cVar3 + -0x80;
            }
            cVar3 = *(char *)(lVar6 + (ulong)(iVar7 + 2));
            if (cVar3 != '\0') {
              *(char *)((long)param + lVar10 + 0x4f) = cVar3 + -0x80;
            }
          }
        }
        lVar10 = lVar10 + 0x1c;
      } while (lVar10 != 0x70);
      pDVar4[uVar8] = iVar9 >> 2;
      pDVar5[uVar8] = iVar9 >> 2;
      uVar8 = uVar8 + 1;
    } while (uVar8 != samples);
  }
  return;
}

Assistant:

static void IremGA20_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ga20_state *chip = (ga20_state *)param;
	DEV_SMPL *outL, *outR;
	UINT32 i;
	int j;
	DEV_SMPL smpl_int;
	DEV_SMPL sampleout;
	struct IremGA20_channel_def* ch;

	outL = outputs[0];
	outR = outputs[1];

	for (i = 0; i < samples; i++)
	{
		sampleout = 0;

		for (j = 0; j < 4; j++)
		{
			ch = &chip->channel[j];
			if (ch->Muted || ! ch->play)
				continue;
			
			if (! chip->interpolate)
			{
				sampleout += ch->smpl1 * (INT32)ch->volume;
			}
			else
			{
				smpl_int = (ch->smpl1 * ((1 << RATE_SHIFT) - ch->frac) + ch->smpl2 * ch->frac);
				sampleout += (smpl_int * (INT32)ch->volume) >> RATE_SHIFT;
			}
			ch->frac += ch->fracrate;
			ch->counter ++;
			if (! ch->counter)
			{
				// advance position + reset counter on overflow
				ch->pos ++;
				ch->frac = 0;
				ch->counter = ch->rate;
				irem_ga20_cache_samples(chip, ch);
			}
		}

		sampleout >>= 2;
		outL[i] = sampleout;
		outR[i] = sampleout;
	}
}